

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::recomputeSurpluses<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this)

{
  MultiIndexSet *mset;
  double dVar1;
  int iVar2;
  int *piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  bool bVar7;
  int *piVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int *piVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  size_t sVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  size_t sVar21;
  long lVar22;
  vector<int,_std::allocator<int>_> vpntr;
  bool is_complete;
  Data2D<int> dagUp;
  vector<int,_std::allocator<int>_> vindx;
  vector<double,_std::allocator<double>_> vvals;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  lines1d;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  map;
  vector<int,_std::allocator<int>_> local_148;
  bool local_12d;
  int local_12c;
  long local_128;
  int local_11c;
  Data2D<int> local_118;
  GridLocalPolynomial *local_f0;
  ulong local_e8;
  size_t local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<double,_std::allocator<double>_> local_b8;
  pointer local_a0;
  long local_98;
  pointer local_90;
  ulong local_88;
  pointer local_80;
  ulong local_78;
  pointer local_70;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  sVar16 = (size_t)(this->super_BaseCanonicalGrid).num_outputs;
  sVar21 = (size_t)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  ::std::vector<double,std::allocator<double>>::
  vector<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,void>
            ((vector<double,std::allocator<double>> *)&local_148,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (this->super_BaseCanonicalGrid).values.values.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                       )(this->super_BaseCanonicalGrid).values.values.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish,(allocator_type *)&local_d8);
  local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
  local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->surpluses).stride = sVar16;
  (this->surpluses).num_strips = sVar21;
  local_118.stride = sVar16;
  local_118.num_strips = sVar21;
  ::std::vector<double,_std::allocator<double>_>::operator=
            (&(this->surpluses).vec,(vector<double,_std::allocator<double>_> *)&local_118.vec);
  if (local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  mset = &(this->super_BaseCanonicalGrid).points;
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  if ((iVar2 < 3) ||
     ((iVar2 == 3 && (2000000 < (this->super_BaseCanonicalGrid).points.cache_num_indexes)))) {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&local_118,mset);
    HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>(&local_148,mset);
    updateSurpluses<(TasGrid::RuleLocal::erule)3>
              (this,mset,this->top_level,(vector<int,_std::allocator<int>_> *)&local_148,&local_118)
    ;
  }
  else {
    local_12d = true;
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&local_118,mset,&local_12d);
    if (local_12d == false) {
      HierarchyManipulations::computeLevels<(TasGrid::RuleLocal::erule)3>(&local_148,mset);
      updateSurpluses<(TasGrid::RuleLocal::erule)3>
                (this,mset,this->top_level,(vector<int,_std::allocator<int>_> *)&local_148,
                 &local_118);
    }
    else {
      piVar14 = (this->super_BaseCanonicalGrid).points.indexes.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      piVar3 = (this->super_BaseCanonicalGrid).points.indexes.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      piVar12 = piVar14 + 1;
      if (piVar12 != piVar3 && piVar14 != piVar3) {
        do {
          piVar8 = piVar12;
          if (*piVar12 <= *piVar14) {
            piVar8 = piVar14;
          }
          piVar14 = piVar8;
          piVar12 = piVar12 + 1;
        } while (piVar12 != piVar3);
      }
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      RuleLocal::van_matrix<(TasGrid::RuleLocal::erule)3>
                (this->order,*piVar14 + 1,(vector<int,_std::allocator<int>_> *)&local_148,&local_d8,
                 &local_b8);
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      MultiIndexManipulations::resortIndexes(mset,&local_48,&local_68);
      local_128 = (long)(this->super_BaseCanonicalGrid).num_dimensions;
      if (0 < local_128) {
        local_a0 = local_68.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_98 = local_128;
          lVar10 = local_128 + -1;
          local_80 = local_68.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar10].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
          uVar9 = (int)((ulong)((long)local_68.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar10].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)local_80) >> 2) - 1;
          if (0 < (int)uVar9) {
            local_90 = local_48.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar10;
            sVar16 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            local_e0 = (this->surpluses).stride;
            pdVar4 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            piVar5 = (this->super_BaseCanonicalGrid).points.indexes.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            local_70 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_88 = (ulong)uVar9;
            uVar20 = 0;
            do {
              local_78 = uVar20;
              uVar9 = local_80[local_78];
              local_e8 = (ulong)uVar9;
              local_11c = local_80[local_78 + 1];
              if ((int)(uVar9 + 1) < local_11c) {
                piVar6 = (local_90->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                local_12c = piVar5[lVar10 + (long)piVar6[(int)uVar9] * sVar16];
                lVar15 = (long)(int)uVar9 + 1;
                do {
                  iVar2 = piVar5[lVar10 + sVar16 * (long)piVar6[lVar15]];
                  iVar18 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar2];
                  lVar22 = (long)iVar18;
                  iVar19 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar22];
                  if ((iVar19 < iVar2) || (local_12c < iVar2)) {
                    lVar13 = (long)piVar6[lVar15] * local_e0;
                    uVar9 = (this->super_BaseCanonicalGrid).num_outputs;
                    uVar20 = local_e8;
                    iVar17 = local_12c;
                    do {
                      if (iVar19 < iVar17) {
                        iVar18 = iVar18 + 1;
                      }
                      else {
                        iVar11 = (int)uVar20;
                        if (iVar19 <= iVar17) {
                          if (0 < (int)uVar9) {
                            iVar19 = piVar6[iVar11];
                            dVar1 = local_b8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar22];
                            uVar20 = 0;
                            do {
                              pdVar4[lVar13 + uVar20] =
                                   pdVar4[(long)iVar19 * local_e0 + uVar20] * -dVar1 +
                                   pdVar4[lVar13 + uVar20];
                              uVar20 = uVar20 + 1;
                            } while (uVar9 != uVar20);
                          }
                          iVar18 = iVar18 + 1;
                        }
                        uVar20 = (ulong)(iVar11 + 1);
                        iVar17 = piVar5[lVar10 + (long)piVar6[(long)iVar11 + 1] * sVar16];
                      }
                      lVar22 = (long)iVar18;
                      iVar19 = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar22];
                    } while ((iVar19 < iVar2) || (iVar17 < iVar2));
                  }
                  lVar15 = lVar15 + 1;
                } while (local_11c != (int)lVar15);
              }
              uVar20 = local_78 + 1;
            } while (local_78 + 1 != local_88);
          }
          bVar7 = 1 < local_128;
          local_128 = lVar10;
        } while (bVar7);
      }
      local_f0 = this;
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_68);
      ::std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_48);
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridLocalPolynomial::recomputeSurpluses() {
    surpluses = Data2D<double>(num_outputs, points.getNumIndexes(), std::vector<double>(values.begin(), values.end()));

    // There are two available algorithms here:
    // - global sparse Kronecker (kron), implemented here in recomputeSurpluses()
    // - sparse matrix in matrix-free form (mat), implemented in updateSurpluses()
    //
    // (kron) has the additional restriction that it will only work when the hierarchy is complete
    // i.e., all point (multi-indexes) have all of their parents
    // this is guaranteed for a full-tensor grid, non-adaptive grid, or a grid adapted with the stable refinement strategy
    // other refinement strategies or using dynamic refinement (even with a stable refinement strategy)
    // may yield a hierarchy-complete grid, but this is not mathematically guaranteed
    //
    // computing the dagUp allows us to check (at runtime) if the grid is_complete, and exclude (kron) if incomplete
    //    the completeness check can be done on the fly but it does incur cost
    //
    // approximate computational cost, let n be the number of points and d be the number of dimensions
    // (kron) d n n^(1/d) due to standard Kronecker reasons, except it is hard to find the "effective" n due to sparsity
    // (mat) d^2 n log(n) since there are d log(n) ancestors and basis functions are product of d one dimensional functions
    //    naturally, there are constants and those also depend on the system, e.g., number of threads, thread scheduling, cache ...
    //    (mat) has a more even load per thread and parallelizes better
    //
    // for d = 1, the algorithms are the same, except (kron) explicitly forms the matrix and the matrix free (mat) version is much better
    // for d = 2, the (mat) algorithm is still faster
    // for d = 3, and sufficiently large size the (mat) algorithm still wins
    //            the breaking point depends on n, the order and system
    // for d = 4 and above, the (kron) algorithm is much faster
    //           it is possible that for sufficiently large n (mat) will win again
    //           but tested on 12 cores CPUs (Intel and AMD) up to n = 3.5 million, the (kron) method is over 2x faster
    // higher dimensions will favor (kron) even more

    if (num_dimensions <= 2 or (num_dimensions == 3 and points.getNumIndexes() > 2000000)) {
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);
        std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(points);
        updateSurpluses<effrule>(points, top_level, level, dagUp);
        return;
    }

    bool is_complete = true;
    Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points, is_complete);

    if (not is_complete) {
        // incomplete hierarchy, must use the slow algorithm
        std::vector<int> level = HierarchyManipulations::computeLevels<effrule>(points);
        updateSurpluses<effrule>(points, top_level, level, dagUp);
        return;
    }

    int num_nodes = 1 + *std::max_element(points.begin(), points.end());

    std::vector<int> vpntr, vindx;
    std::vector<double> vvals;
    RuleLocal::van_matrix<effrule>(order, num_nodes, vpntr, vindx, vvals);

    std::vector<std::vector<int>> map;
    std::vector<std::vector<int>> lines1d;
    MultiIndexManipulations::resortIndexes(points, map, lines1d);

    for(int d=num_dimensions-1; d>=0; d--) {
        #pragma omp parallel for schedule(dynamic)
        for(int job = 0; job < static_cast<int>(lines1d[d].size() - 1); job++) {
            for(int i=lines1d[d][job]+1; i<lines1d[d][job+1]; i++) {
                double *row_strip = surpluses.getStrip(map[d][i]);

                int row = points.getIndex(map[d][i])[d];
                int im  = vpntr[row];
                int ijx = lines1d[d][job];
                int ix  = points.getIndex(map[d][ijx])[d];

                while(vindx[im] < row or ix < row) {
                    if (vindx[im] < ix) {
                        ++im; // move the index of the matrix pattern (missing entry)
                    } else if (ix < vindx[im]) {
                        // entry not connected, move to the next one
                        ++ijx;
                        ix = points.getIndex(map[d][ijx])[d];
                    } else {
                        double const *col_strip = surpluses.getStrip(map[d][ijx]);
                        double const v = vvals[im];
                        for(int k=0; k<num_outputs; k++)
                            row_strip[k] -= v * col_strip[k];

                        ++im;
                        ++ijx;
                        ix = points.getIndex(map[d][ijx])[d];
                    }
                }
            }
        }
    }
}